

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

int ptyfd_compare(void *av,void *bv)

{
  PtyFd *b;
  PtyFd *a;
  void *bv_local;
  void *av_local;
  
  if (*av < *bv) {
    av_local._4_4_ = -1;
  }
  else if (*bv < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int ptyfd_compare(void *av, void *bv)
{
    PtyFd *a = (PtyFd *)av;
    PtyFd *b = (PtyFd *)bv;

    if (a->fd < b->fd)
        return -1;
    else if (a->fd > b->fd)
        return +1;
    return 0;
}